

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

void add_buffer_to_pending_queue(CManager_conflict cm,CMConnection conn,CMbuffer buf,long length)

{
  CManager_conflict p_Var1;
  int iVar2;
  pending_queue ppVar3;
  long in_RCX;
  CMbuffer in_RDX;
  CMConnection_conflict in_RSI;
  CManager in_RDI;
  pending_queue tmp;
  pending_queue last;
  pending_queue entry;
  CManager_conflict local_38;
  CManager_conflict in_stack_ffffffffffffffd0;
  
  iVar2 = CManager_locked(in_RDI);
  if (iVar2 != 0) {
    ppVar3 = (pending_queue)INT_CMmalloc((size_t)in_stack_ffffffffffffffd0);
    ppVar3->next = (pending_queue_entry *)0x0;
    ppVar3->conn = in_RSI;
    ppVar3->buffer = in_RDX;
    ppVar3->length = in_RCX;
    if (in_RDI->pending_data_queue == (pending_queue)0x0) {
      in_RDI->pending_data_queue = ppVar3;
    }
    else {
      p_Var1 = *(CManager_conflict *)&((CManager_conflict)in_RDI->pending_data_queue)->CManager_ID;
      in_stack_ffffffffffffffd0 = (CManager_conflict)in_RDI->pending_data_queue;
      while (local_38 = p_Var1, local_38 != (CManager_conflict)0x0) {
        in_stack_ffffffffffffffd0 = local_38;
        p_Var1 = *(CManager_conflict *)&local_38->CManager_ID;
      }
      *(pending_queue *)&in_stack_ffffffffffffffd0->CManager_ID = ppVar3;
    }
    CMwake_server_thread(in_stack_ffffffffffffffd0);
    return;
  }
  __assert_fail("CManager_locked(cm)",
                "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                ,0x7c7,"void add_buffer_to_pending_queue(CManager, CMConnection, CMbuffer, long)");
}

Assistant:

static void add_buffer_to_pending_queue(CManager cm, CMConnection conn, CMbuffer buf, long length)
 {
     assert(CManager_locked(cm));
     pending_queue entry = malloc(sizeof(struct pending_queue_entry));
     entry->next = NULL;
     entry->conn = conn;
     entry->buffer = buf;
     entry->length = length;
     if (!cm->pending_data_queue) {
	 cm->pending_data_queue = entry;
     } else {
	 pending_queue last = cm->pending_data_queue;
	 pending_queue tmp = last->next;
	 while (tmp) {
	     last = tmp;
	     tmp = tmp->next;
	 }
	 last->next = entry;
     }
     CMwake_server_thread(cm);
 }